

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuVector.hpp
# Opt level: O1

bool tcu::isInColorBounds(LookupPrecision *prec,ColorQuad *quad0,ColorQuad *quad1,Vec4 *result)

{
  float fVar1;
  float fVar2;
  ulong uVar3;
  int i;
  long lVar4;
  ulong uVar5;
  uint uVar6;
  Vector<float,_4> res;
  Vec4 maxVal;
  Vector<bool,_4> res_19;
  Vector<bool,_4> res_17;
  Vector<float,_4> res_5;
  Vector<float,_4> res_2;
  Vec4 minVal;
  
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad0->p01).m_data[lVar4];
    fVar2 = (quad0->p11).m_data[lVar4];
    uVar6 = -(uint)(fVar1 <= fVar2);
    res.m_data[lVar4] = (float)(~uVar6 & (uint)fVar2 | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  maxVal.m_data[0] = 0.0;
  maxVal.m_data[1] = 0.0;
  maxVal.m_data[2] = 0.0;
  maxVal.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad0->p10).m_data[lVar4];
    uVar6 = -(uint)(fVar1 <= res.m_data[lVar4]);
    maxVal.m_data[lVar4] = (float)(~uVar6 & (uint)res.m_data[lVar4] | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad0->p00).m_data[lVar4];
    uVar6 = -(uint)(fVar1 <= maxVal.m_data[lVar4]);
    res_2.m_data[lVar4] = (float)(~uVar6 & (uint)maxVal.m_data[lVar4] | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad1->p01).m_data[lVar4];
    fVar2 = (quad1->p11).m_data[lVar4];
    uVar6 = -(uint)(fVar1 <= fVar2);
    res.m_data[lVar4] = (float)(~uVar6 & (uint)fVar2 | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  maxVal.m_data[0] = 0.0;
  maxVal.m_data[1] = 0.0;
  maxVal.m_data[2] = 0.0;
  maxVal.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad1->p10).m_data[lVar4];
    uVar6 = -(uint)(fVar1 <= res.m_data[lVar4]);
    maxVal.m_data[lVar4] = (float)(~uVar6 & (uint)res.m_data[lVar4] | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res_5.m_data[0] = 0.0;
  res_5.m_data[1] = 0.0;
  res_5.m_data[2] = 0.0;
  res_5.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad1->p00).m_data[lVar4];
    uVar6 = -(uint)(fVar1 <= maxVal.m_data[lVar4]);
    res_5.m_data[lVar4] = (float)(~uVar6 & (uint)maxVal.m_data[lVar4] | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  maxVal.m_data[0] = 0.0;
  maxVal.m_data[1] = 0.0;
  maxVal.m_data[2] = 0.0;
  maxVal.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    uVar6 = -(uint)(res_2.m_data[lVar4] <= res_5.m_data[lVar4]);
    maxVal.m_data[lVar4] =
         (float)(~uVar6 & (uint)res_5.m_data[lVar4] | (uint)res_2.m_data[lVar4] & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  minVal.m_data[0] = 0.0;
  minVal.m_data[1] = 0.0;
  minVal.m_data[2] = 0.0;
  minVal.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    minVal.m_data[lVar4] = maxVal.m_data[lVar4] - (prec->colorThreshold).m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad0->p01).m_data[lVar4];
    fVar2 = (quad0->p11).m_data[lVar4];
    uVar6 = -(uint)(fVar2 <= fVar1);
    res.m_data[lVar4] = (float)(~uVar6 & (uint)fVar2 | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  maxVal.m_data[0] = 0.0;
  maxVal.m_data[1] = 0.0;
  maxVal.m_data[2] = 0.0;
  maxVal.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad0->p10).m_data[lVar4];
    uVar6 = -(uint)(res.m_data[lVar4] <= fVar1);
    maxVal.m_data[lVar4] = (float)(~uVar6 & (uint)res.m_data[lVar4] | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res_2.m_data[0] = 0.0;
  res_2.m_data[1] = 0.0;
  res_2.m_data[2] = 0.0;
  res_2.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad0->p00).m_data[lVar4];
    uVar6 = -(uint)(maxVal.m_data[lVar4] <= fVar1);
    res_2.m_data[lVar4] = (float)(~uVar6 & (uint)maxVal.m_data[lVar4] | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad1->p01).m_data[lVar4];
    fVar2 = (quad1->p11).m_data[lVar4];
    uVar6 = -(uint)(fVar2 <= fVar1);
    res.m_data[lVar4] = (float)(~uVar6 & (uint)fVar2 | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  maxVal.m_data[0] = 0.0;
  maxVal.m_data[1] = 0.0;
  maxVal.m_data[2] = 0.0;
  maxVal.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad1->p10).m_data[lVar4];
    uVar6 = -(uint)(res.m_data[lVar4] <= fVar1);
    maxVal.m_data[lVar4] = (float)(~uVar6 & (uint)res.m_data[lVar4] | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res_5.m_data[0] = 0.0;
  res_5.m_data[1] = 0.0;
  res_5.m_data[2] = 0.0;
  res_5.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    fVar1 = (quad1->p00).m_data[lVar4];
    uVar6 = -(uint)(maxVal.m_data[lVar4] <= fVar1);
    res_5.m_data[lVar4] = (float)(~uVar6 & (uint)maxVal.m_data[lVar4] | (uint)fVar1 & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res.m_data[0] = 0.0;
  res.m_data[1] = 0.0;
  res.m_data[2] = 0.0;
  res.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    uVar6 = -(uint)(res_5.m_data[lVar4] <= res_2.m_data[lVar4]);
    res.m_data[lVar4] =
         (float)(~uVar6 & (uint)res_5.m_data[lVar4] | (uint)res_2.m_data[lVar4] & uVar6);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  maxVal.m_data[0] = 0.0;
  maxVal.m_data[1] = 0.0;
  maxVal.m_data[2] = 0.0;
  maxVal.m_data[3] = 0.0;
  lVar4 = 0;
  do {
    maxVal.m_data[lVar4] = res.m_data[lVar4] + (prec->colorThreshold).m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res_5.m_data._0_8_ = res_5.m_data._0_8_ & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(bool *)((long)res_5.m_data + lVar4) = minVal.m_data[lVar4] <= result->m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res_17.m_data[0] = false;
  res_17.m_data[1] = false;
  res_17.m_data[2] = false;
  res_17.m_data[3] = false;
  lVar4 = 0;
  do {
    res_17.m_data[lVar4] = result->m_data[lVar4] <= maxVal.m_data[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res_2.m_data._0_8_ = res_2.m_data._0_8_ & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(byte *)((long)res_2.m_data + lVar4) =
         res_17.m_data[lVar4] & *(byte *)((long)res_5.m_data + lVar4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res_19.m_data[0] = false;
  res_19.m_data[1] = false;
  res_19.m_data[2] = false;
  res_19.m_data[3] = false;
  lVar4 = 0;
  do {
    res_19.m_data[lVar4] = (bool)((prec->colorMask).m_data[lVar4] ^ 1);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  res.m_data._0_8_ = res.m_data._0_8_ & 0xffffffff00000000;
  lVar4 = 0;
  do {
    *(byte *)((long)res.m_data + lVar4) =
         res_19.m_data[lVar4] | *(byte *)((long)res_2.m_data + lVar4);
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  if (res.m_data[0]._0_1_ == '\0') {
    return false;
  }
  uVar3 = 0;
  do {
    uVar5 = uVar3;
    if (uVar5 == 3) break;
    uVar3 = uVar5 + 1;
  } while (*(char *)((long)res.m_data + uVar5 + 1) != '\0');
  return 2 < uVar5;
}

Assistant:

inline Vector<T, Size>::Vector (void)
{
	for (int i = 0; i < Size; i++)
		m_data[i] = T();
}